

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O3

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  SeparatedSyntaxList<slang::syntax::DeclaratorSyntax> *args_3;
  SyntaxList<slang::syntax::VariableDimensionSyntax> *args_5;
  EnumTypeSyntax *pEVar1;
  DeepCloneVisitor visitor;
  Token local_68;
  Token local_58;
  SyntaxNode *local_48;
  Token local_40;
  
  local_68 = parsing::Token::deepClone((Token *)(__fn + 0x18),(BumpAllocator *)__child_stack);
  if (*(SyntaxNode **)(__fn + 0x28) == (SyntaxNode *)0x0) {
    local_48 = (SyntaxNode *)0x0;
  }
  else {
    local_48 = detail::
               visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                         (*(SyntaxNode **)(__fn + 0x28),(DeepCloneVisitor *)&local_58,
                          (BumpAllocator *)__child_stack);
  }
  local_58 = parsing::Token::deepClone((Token *)(__fn + 0x30),(BumpAllocator *)__child_stack);
  args_3 = deepClone<slang::syntax::DeclaratorSyntax>
                     ((SeparatedSyntaxList<slang::syntax::DeclaratorSyntax> *)(__fn + 0x40),
                      (BumpAllocator *)__child_stack);
  local_40 = parsing::Token::deepClone((Token *)(__fn + 0x78),(BumpAllocator *)__child_stack);
  args_5 = deepClone<slang::syntax::VariableDimensionSyntax>
                     ((SyntaxList<slang::syntax::VariableDimensionSyntax> *)(__fn + 0x88),
                      (BumpAllocator *)__child_stack);
  pEVar1 = BumpAllocator::
           emplace<slang::syntax::EnumTypeSyntax,slang::parsing::Token,slang::syntax::DataTypeSyntax*,slang::parsing::Token,slang::syntax::SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>&,slang::parsing::Token,slang::syntax::SyntaxList<slang::syntax::VariableDimensionSyntax>&>
                     ((BumpAllocator *)__child_stack,&local_68,(DataTypeSyntax **)&local_48,
                      &local_58,args_3,&local_40,args_5);
  return (int)pEVar1;
}

Assistant:

static SyntaxNode* clone(const EnumTypeSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<EnumTypeSyntax>(
        node.keyword.deepClone(alloc),
        node.baseType ? deepClone(*node.baseType, alloc) : nullptr,
        node.openBrace.deepClone(alloc),
        *deepClone(node.members, alloc),
        node.closeBrace.deepClone(alloc),
        *deepClone(node.dimensions, alloc)
    );
}